

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

int __thiscall
vera::TriangulatorData::AddTriangle
          (TriangulatorData *this,int a,int b,int c,int ab,int bc,int ca,int e)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  iterator __position;
  iterator iVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  iterator iVar7;
  float local_40;
  int local_3c;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  uVar6 = (ulong)(uint)e;
  local_3c = bc;
  local_38 = ab;
  local_34 = c;
  local_30 = b;
  local_2c = a;
  if (e < 0) {
    pvVar1 = &this->triangles;
    iVar3._M_current =
         (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar4 = (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    piVar2 = (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar3._M_current == piVar4) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)pvVar1,iVar3,&local_2c);
      iVar7._M_current =
           (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar4 = (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = a;
      iVar7._M_current = iVar3._M_current + 1;
      (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar7._M_current;
    }
    if (iVar7._M_current == piVar4) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)pvVar1,iVar7,&local_30);
      iVar7._M_current =
           (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar4 = (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar7._M_current = b;
      iVar7._M_current = iVar7._M_current + 1;
      (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar7._M_current;
    }
    if (iVar7._M_current == piVar4) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)pvVar1,iVar7,&local_34);
    }
    else {
      *iVar7._M_current = c;
      (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar7._M_current + 1;
    }
    pvVar1 = &this->halfedges;
    iVar7._M_current =
         (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar4 = (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar7._M_current == piVar4) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)pvVar1,iVar7,(int *)&local_38);
      iVar7._M_current =
           (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar4 = (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar7._M_current = local_38;
      iVar7._M_current = iVar7._M_current + 1;
      (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar7._M_current;
    }
    if (iVar7._M_current == piVar4) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)pvVar1,iVar7,&local_3c);
      iVar7._M_current =
           (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar4 = (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar7._M_current = local_3c;
      iVar7._M_current = iVar7._M_current + 1;
      (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar7._M_current;
    }
    if (iVar7._M_current == piVar4) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)pvVar1,iVar7,&ca);
    }
    else {
      *iVar7._M_current = ca;
      (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar7._M_current + 1;
    }
    local_40 = 0.0;
    std::
    vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
    ::emplace_back<int>(&this->candidates,(int *)&local_40);
    local_40 = 0.0;
    __position._M_current =
         (this->errors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->errors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&this->errors,__position,&local_40);
    }
    else {
      *__position._M_current = 0.0;
      (this->errors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    iVar5 = (int)((ulong)((long)iVar3._M_current - (long)piVar2) >> 2);
    local_40 = -NAN;
    iVar3._M_current =
         (this->queueIndexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->queueIndexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->queueIndexes,iVar3,(int *)&local_40);
    }
    else {
      *iVar3._M_current = -1;
      (this->queueIndexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
  }
  else {
    piVar2 = (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2[uVar6] = a;
    piVar2[uVar6 + 1] = b;
    piVar2[uVar6 + 2] = c;
    piVar2 = (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2[uVar6] = ab;
    piVar2[uVar6 + 1] = bc;
    piVar2[uVar6 + 2] = ca;
    iVar5 = e;
  }
  if (-1 < (int)local_38) {
    (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_38] = iVar5;
  }
  if (-1 < (long)local_3c) {
    (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_3c] = iVar5 + 1;
  }
  if (-1 < (long)ca) {
    (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[ca] = iVar5 + 2;
  }
  local_40 = (float)(iVar5 / 3);
  iVar3._M_current =
       (this->pending).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar3._M_current ==
      (this->pending).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->pending,iVar3,(int *)&local_40);
  }
  else {
    *iVar3._M_current = (int)local_40;
    (this->pending).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  return iVar5;
}

Assistant:

int AddTriangle(const int a, const int b, const int c,
                    const int ab, const int bc, const int ca,
                    int e) {
        if (e < 0) {
            // new halfedge index
            e = triangles.size();
            // add triangle vertices
            triangles.push_back(a);
            triangles.push_back(b);
            triangles.push_back(c);
            // add triangle halfedges
            halfedges.push_back(ab);
            halfedges.push_back(bc);
            halfedges.push_back(ca);
            // add triangle metadata
            candidates.emplace_back(0);
            errors.push_back(0);
            queueIndexes.push_back(-1);
        } 
        else {
            // set triangle vertices
            triangles[e + 0] = a;
            triangles[e + 1] = b;
            triangles[e + 2] = c;
            // set triangle halfedges
            halfedges[e + 0] = ab;
            halfedges[e + 1] = bc;
            halfedges[e + 2] = ca;
        }

        // link neighboring halfedges
        if (ab >= 0)
            halfedges[ab] = e + 0;
        if (bc >= 0)
            halfedges[bc] = e + 1;
        if (ca >= 0)
            halfedges[ca] = e + 2;

        // add triangle to pending queue for later rasterization
        const int t = e / 3;
        pending.push_back(t);

        // return first halfedge index
        return e;
    }